

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicInputCase1::Run(BasicInputCase1 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  undefined8 local_2c;
  undefined4 local_24;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x18,(void *)0x0,0x88e4);
  local_2c = 0x400000003f800000;
  local_24 = 0x40400000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0xc,&local_2c);
  local_2c = 0x40a0000040800000;
  local_24 = 0x40c00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0xc,&local_2c);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0xc);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,3,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 3.0;
  pVVar1[1].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[0] = 4.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[1] = 5.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 6.0;
  pVVar1[0x11].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec3), &Vec3(1.0f, 2.0f, 3.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(Vec3), &Vec3(4.0f, 5.0f, 6.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glBindVertexBuffer(0, m_vbo, 0, 12);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribBinding(1, 0);
		glEnableVertexAttribArray(1);

		expected_data[1]  = Vec4(1.0f, 2.0f, 3.0f, 1.0f);
		expected_data[17] = Vec4(4.0f, 5.0f, 6.0f, 1.0f);
		return BasicInputBase::Run();
	}